

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusGF.h
# Opt level: O0

int __thiscall ZXing::Pdf417::ModulusGF::multiply(ModulusGF *this,int a,int b)

{
  short sVar1;
  const_reference pvVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined4 local_4;
  
  if ((in_ESI == 0) || (in_EDX == 0)) {
    local_4 = 0;
  }
  else {
    pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x20),(long)in_ESI);
    sVar1 = *pvVar2;
    pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x20),(long)in_EDX);
    pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),
                        (long)((int)sVar1 + (int)*pvVar2));
    local_4 = (int)*pvVar2;
  }
  return local_4;
}

Assistant:

int multiply(int a, int b) const {
		if (a == 0 || b == 0) {
			return 0;
		}
#ifdef ZX_REED_SOLOMON_USE_MORE_MEMORY_FOR_SPEED
		return _expTable[_logTable[a] + _logTable[b]];
#else
		return _expTable[fast_mod(_logTable[a] + _logTable[b], _modulus - 1)];
#endif
	}